

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::DescriptorProto::~DescriptorProto(DescriptorProto *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DescriptorProto_00297c10;
  SharedDtor(this);
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::~RepeatedPtrField
            (&this->extension_range_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::~RepeatedPtrField(&this->enum_type_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::~RepeatedPtrField(&this->nested_type_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::~RepeatedPtrField(&this->extension_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::~RepeatedPtrField(&this->field_);
  UnknownFieldSet::~UnknownFieldSet(&this->_unknown_fields_);
  Message::~Message(&this->super_Message);
  return;
}

Assistant:

DescriptorProto::~DescriptorProto() {
  SharedDtor();
}